

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sign.cpp
# Opt level: O0

bool __thiscall
MutableTransactionSignatureCreator::CreateSig
          (MutableTransactionSignatureCreator *this,SigningProvider *provider,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *vchSig,CKeyID *address,
          CScript *scriptCode,SigVersion sigversion)

{
  byte bVar1;
  bool bVar2;
  undefined8 in_RCX;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_RDX;
  uint256 *in_RSI;
  CKey *in_RDI;
  int in_R9D;
  long in_FS_OFFSET;
  int hashtype;
  CKey key;
  uint256 hash;
  SigVersion in_stack_00000230;
  PrecomputedTransactionData *in_stack_00000238;
  int in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff3c;
  undefined4 local_a8;
  undefined7 in_stack_ffffffffffffff68;
  undefined3 in_stack_ffffffffffffff78;
  undefined4 uVar3;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  CKey *this_00;
  bool local_3a;
  undefined1 local_38 [48];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  uVar3 = CONCAT13(1,in_stack_ffffffffffffff78);
  if (in_R9D != 0) {
    uVar3 = CONCAT13(in_R9D == 1,in_stack_ffffffffffffff78);
  }
  if ((char)((uint)uVar3 >> 0x18) == '\0') {
    __assert_fail("sigversion == SigVersion::BASE || sigversion == SigVersion::WITNESS_V0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/script/sign.cpp"
                  ,0x27,
                  "virtual bool MutableTransactionSignatureCreator::CreateSig(const SigningProvider &, std::vector<unsigned char> &, const CKeyID &, const CScript &, SigVersion) const"
                 );
  }
  this_00 = in_RDI;
  CKey::CKey((CKey *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
  bVar1 = (**(code **)(*(long *)(in_RSI->super_base_blob<256U>).m_data._M_elems + 0x28))
                    (in_RSI,in_RCX,local_38);
  if ((bVar1 & 1) == 0) {
    local_3a = false;
    in_R9D = in_stack_ffffffffffffff38;
  }
  else {
    if (in_R9D == 1) {
      bVar2 = CKey::IsCompressed((CKey *)CONCAT44(in_stack_ffffffffffffff3c,
                                                  in_stack_ffffffffffffff38));
      if (!bVar2) {
        local_3a = false;
        in_R9D = in_stack_ffffffffffffff38;
        goto LAB_00f0a2ce;
      }
    }
    if (in_R9D == 1) {
      bVar2 = MoneyRange((CAmount *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
      if (!bVar2) {
        local_3a = false;
        in_R9D = in_stack_ffffffffffffff38;
        goto LAB_00f0a2ce;
      }
    }
    if (*(int *)&in_RDI[1].field_0x4 == 0) {
      local_a8 = 1;
    }
    else {
      local_a8 = *(undefined4 *)&in_RDI[1].field_0x4;
    }
    SignatureHash<CMutableTransaction>
              ((CScript *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
               (CMutableTransaction *)CONCAT44(local_a8,uVar3),(uint)((ulong)in_RDI >> 0x20),
               (int32_t)((ulong)in_RCX >> 0x20),(CAmount *)CONCAT17(bVar1,in_stack_ffffffffffffff68)
               ,in_stack_00000230,in_stack_00000238);
    bVar2 = CKey::Sign(this_00,in_RSI,in_RDX,SUB81((ulong)in_RCX >> 0x38,0),(uint32_t)in_RCX);
    if (bVar2) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                 CONCAT44(in_stack_ffffffffffffff3c,in_R9D),(value_type_conflict *)0xf0a2bc);
      local_3a = true;
    }
    else {
      local_3a = false;
    }
  }
LAB_00f0a2ce:
  CKey::~CKey((CKey *)CONCAT44(in_stack_ffffffffffffff3c,in_R9D));
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_3a;
  }
  __stack_chk_fail();
}

Assistant:

bool MutableTransactionSignatureCreator::CreateSig(const SigningProvider& provider, std::vector<unsigned char>& vchSig, const CKeyID& address, const CScript& scriptCode, SigVersion sigversion) const
{
    assert(sigversion == SigVersion::BASE || sigversion == SigVersion::WITNESS_V0);

    CKey key;
    if (!provider.GetKey(address, key))
        return false;

    // Signing with uncompressed keys is disabled in witness scripts
    if (sigversion == SigVersion::WITNESS_V0 && !key.IsCompressed())
        return false;

    // Signing without known amount does not work in witness scripts.
    if (sigversion == SigVersion::WITNESS_V0 && !MoneyRange(amount)) return false;

    // BASE/WITNESS_V0 signatures don't support explicit SIGHASH_DEFAULT, use SIGHASH_ALL instead.
    const int hashtype = nHashType == SIGHASH_DEFAULT ? SIGHASH_ALL : nHashType;

    uint256 hash = SignatureHash(scriptCode, m_txto, nIn, hashtype, amount, sigversion, m_txdata);
    if (!key.Sign(hash, vchSig))
        return false;
    vchSig.push_back((unsigned char)hashtype);
    return true;
}